

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O1

Cnf_Dat_t * Cnf_DataAlloc(Aig_Man_t *pAig,int nVars,int nClauses,int nLiterals)

{
  Vec_Ptr_t *pVVar1;
  Cnf_Dat_t *pCVar2;
  int **ppiVar3;
  int *piVar4;
  long lVar5;
  
  pCVar2 = (Cnf_Dat_t *)malloc(0x48);
  pCVar2->pMan = (Aig_Man_t *)0x0;
  pCVar2->nVars = 0;
  pCVar2->nLiterals = 0;
  *(undefined8 *)&pCVar2->nClauses = 0;
  pCVar2->pClauses = (int **)0x0;
  pCVar2->pVarNums = (int *)0x0;
  pCVar2->pObj2Clause = (int *)0x0;
  pCVar2->pObj2Count = (int *)0x0;
  pCVar2->pClaPols = (uchar *)0x0;
  pCVar2->vMapping = (Vec_Int_t *)0x0;
  pCVar2->pMan = pAig;
  pCVar2->nVars = nVars;
  pCVar2->nClauses = nClauses;
  pCVar2->nLiterals = nLiterals;
  ppiVar3 = (int **)malloc((long)nClauses * 8 + 8);
  pCVar2->pClauses = ppiVar3;
  piVar4 = (int *)malloc((long)nLiterals * 4);
  *ppiVar3 = piVar4;
  ppiVar3[nClauses] = piVar4 + nLiterals;
  pVVar1 = pAig->vObjs;
  lVar5 = (long)pVVar1->nSize;
  piVar4 = (int *)malloc(lVar5 * 4);
  pCVar2->pVarNums = piVar4;
  if (0 < lVar5) {
    lVar5 = 0;
    do {
      piVar4[lVar5] = -1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar1->nSize);
  }
  return pCVar2;
}

Assistant:

Cnf_Dat_t * Cnf_DataAlloc( Aig_Man_t * pAig, int nVars, int nClauses, int nLiterals )
{
    Cnf_Dat_t * pCnf;
    int i;
    pCnf = ABC_ALLOC( Cnf_Dat_t, 1 );
    memset( pCnf, 0, sizeof(Cnf_Dat_t) );
    pCnf->pMan = pAig;
    pCnf->nVars = nVars;
    pCnf->nClauses = nClauses;
    pCnf->nLiterals = nLiterals;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(pAig) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(pAig) );
    for ( i = 0; i < Aig_ManObjNumMax(pAig); i++ )
        pCnf->pVarNums[i] = -1;
    return pCnf;
}